

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_shard.c
# Opt level: O2

REF_STATUS ref_shard_prism_into_tet(REF_GRID ref_grid,REF_INT keeping_n_layers,REF_DICT of_faceid)

{
  int iVar1;
  REF_NODE ref_node;
  REF_CELL pRVar2;
  REF_ADJ pRVar3;
  REF_GRID pRVar4;
  REF_STATUS RVar5;
  uint uVar6;
  REF_BOOL RVar7;
  REF_INT *vector;
  ulong uVar8;
  void *__ptr;
  long lVar9;
  int iVar10;
  undefined8 uVar11;
  long lVar12;
  char *pcVar13;
  int iVar14;
  REF_CELL pRVar15;
  int iVar16;
  ulong uVar17;
  bool bVar18;
  REF_INT tri_mark;
  REF_CELL local_288;
  REF_DICT local_280;
  REF_CELL local_278;
  REF_CELL local_270;
  REF_GRID local_268;
  REF_CELL local_260;
  int local_258;
  int iStack_254;
  int iStack_250;
  REF_INT local_24c;
  REF_INT orig [27];
  REF_INT qua_nodes [27];
  REF_GLOB qua_global [27];
  
  ref_node = ref_grid->node;
  uVar17 = (ulong)ref_node->max;
  local_280 = of_faceid;
  if ((long)uVar17 < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",0x3a9,
           "ref_shard_prism_into_tet","malloc mark of REF_INT negative");
    return 1;
  }
  pRVar2 = ref_grid->cell[10];
  local_260 = ref_grid->cell[8];
  local_270 = ref_grid->cell[9];
  local_278 = ref_grid->cell[6];
  local_288 = ref_grid->cell[3];
  vector = (REF_INT *)malloc(uVar17 * 4);
  if (vector == (REF_INT *)0x0) {
    pcVar13 = "malloc mark of REF_INT NULL";
    uVar11 = 0x3a9;
  }
  else {
    for (uVar8 = 0; uVar8 < uVar17; uVar8 = uVar8 + 1) {
      vector[uVar8] = -1;
    }
    __ptr = malloc(uVar17 * 4);
    if (__ptr != (void *)0x0) {
      for (uVar8 = 0; uVar17 != uVar8; uVar8 = uVar8 + 1) {
        *(undefined4 *)((long)__ptr + uVar8 * 4) = 0xffffffff;
      }
      local_268 = ref_grid;
      if (local_280 != (REF_DICT)0x0 && 0 < keeping_n_layers) {
        pRVar15 = local_288;
        for (iVar14 = 0; iVar14 < pRVar2->max; iVar14 = iVar14 + 1) {
          RVar5 = ref_cell_nodes(pRVar2,iVar14,orig);
          if (RVar5 == 0) {
            local_258 = orig[0];
            iStack_254 = orig[1];
            iStack_250 = orig[2];
            uVar6 = ref_cell_with(pRVar15,&local_258,&tri_mark);
            if ((uVar6 != 0) && (uVar6 != 5)) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c"
                     ,0x3b2,"ref_shard_prism_into_tet",(ulong)uVar6,"with");
              uVar17 = (ulong)uVar6;
            }
            pRVar15 = local_288;
            if ((uVar6 != 5) && (uVar6 != 0)) {
              return (REF_STATUS)uVar17;
            }
            if (((long)tri_mark != -1) &&
               (RVar7 = ref_dict_has_key(local_280,
                                         local_288->c2n
                                         [(long)local_288->size_per * (long)tri_mark + 3]),
               RVar7 != 0)) {
              vector[local_258] = 0;
              vector[iStack_254] = 0;
              vector[iStack_250] = 0;
            }
            local_258 = orig[3];
            iStack_254 = orig[5];
            iStack_250 = orig[4];
            uVar6 = ref_cell_with(pRVar15,&local_258,&tri_mark);
            if ((uVar6 != 0) && (uVar6 != 5)) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c"
                     ,0x3bd,"ref_shard_prism_into_tet",(ulong)uVar6,"with");
              uVar17 = (ulong)uVar6;
            }
            pRVar15 = local_288;
            if ((uVar6 != 5) && (uVar6 != 0)) {
              return (REF_STATUS)uVar17;
            }
            if (((long)tri_mark != -1) &&
               (RVar7 = ref_dict_has_key(local_280,
                                         local_288->c2n
                                         [(long)local_288->size_per * (long)tri_mark + 3]),
               RVar7 != 0)) {
              vector[local_258] = 0;
              vector[iStack_254] = 0;
              vector[iStack_250] = 0;
            }
          }
        }
      }
      uVar6 = ref_node_ghost_int(ref_node,vector,1);
      if (uVar6 == 0) {
        if (keeping_n_layers < 1) {
          keeping_n_layers = 0;
        }
        iVar14 = 0;
        do {
          pRVar15 = local_260;
          if (iVar14 == keeping_n_layers) {
            iVar14 = 0;
            goto LAB_001851b3;
          }
          uVar17 = (ulong)(uint)ref_node->max;
          if (ref_node->max < 1) {
            uVar17 = 0;
          }
          for (uVar8 = 0; uVar17 != uVar8; uVar8 = uVar8 + 1) {
            *(REF_INT *)((long)__ptr + uVar8 * 4) = vector[uVar8];
          }
          for (iVar16 = 0; iVar16 < pRVar2->max; iVar16 = iVar16 + 1) {
            RVar5 = ref_cell_nodes(pRVar2,iVar16,orig);
            if (RVar5 == 0) {
              lVar9 = (long)orig[0];
              iVar1 = *(int *)((long)__ptr + lVar9 * 4);
              iVar10 = *(int *)((long)__ptr + (long)orig[3] * 4);
              if (iVar1 == -1) {
                if (iVar10 != -1) goto LAB_001850d0;
              }
              else {
                bVar18 = iVar10 == -1;
                lVar9 = (long)orig[3];
                iVar10 = iVar1;
                if (bVar18) {
LAB_001850d0:
                  vector[lVar9] = iVar10 + 1;
                }
              }
              lVar9 = (long)orig[1];
              iVar1 = *(int *)((long)__ptr + lVar9 * 4);
              iVar10 = *(int *)((long)__ptr + (long)orig[4] * 4);
              if (iVar1 == -1) {
                if (iVar10 != -1) goto LAB_001850fd;
              }
              else {
                bVar18 = iVar10 == -1;
                lVar9 = (long)orig[4];
                iVar10 = iVar1;
                if (bVar18) {
LAB_001850fd:
                  vector[lVar9] = iVar10 + 1;
                }
              }
              lVar9 = (long)orig[2];
              iVar1 = *(int *)((long)__ptr + lVar9 * 4);
              iVar10 = *(int *)((long)__ptr + (long)orig[5] * 4);
              if (iVar1 == -1) {
                if (iVar10 != -1) goto LAB_0018512a;
              }
              else {
                bVar18 = iVar10 == -1;
                lVar9 = (long)orig[5];
                iVar10 = iVar1;
                if (bVar18) {
LAB_0018512a:
                  vector[lVar9] = iVar10 + 1;
                }
              }
            }
          }
          uVar6 = ref_node_ghost_int(ref_node,vector,1);
          iVar14 = iVar14 + 1;
        } while (uVar6 == 0);
        uVar17 = (ulong)uVar6;
        pcVar13 = "update ghost mark";
        uVar11 = 0x3db;
      }
      else {
        uVar17 = (ulong)uVar6;
        pcVar13 = "update ghost mark";
        uVar11 = 0x3c6;
      }
LAB_0018518c:
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",
             uVar11,"ref_shard_prism_into_tet",uVar17,pcVar13);
      return (REF_STATUS)uVar17;
    }
    pcVar13 = "malloc mark_copy of REF_INT NULL";
    uVar11 = 0x3aa;
  }
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",uVar11,
         "ref_shard_prism_into_tet",pcVar13);
  return 2;
LAB_001851b3:
  if (pRVar2->max <= iVar14) goto LAB_00185226;
  RVar5 = ref_cell_nodes(pRVar2,iVar14,orig);
  if ((RVar5 == 0) && ((vector[orig[0]] == -1 || (vector[orig[3]] == -1)))) {
    uVar6 = ref_cell_remove(pRVar2,iVar14);
    if (uVar6 != 0) {
      uVar17 = (ulong)uVar6;
      pcVar13 = "remove pri";
      uVar11 = 0x3e1;
      goto LAB_0018518c;
    }
    uVar6 = ref_shard_add_pri_as_tet(ref_node,pRVar15,orig,1);
    if (uVar6 != 0) {
      uVar17 = (ulong)uVar6;
      pcVar13 = "converts to tets";
      uVar11 = 0x3e3;
      goto LAB_0018518c;
    }
  }
  iVar14 = iVar14 + 1;
  goto LAB_001851b3;
LAB_00185226:
  for (iVar14 = 0; iVar14 < local_270->max; iVar14 = iVar14 + 1) {
    RVar5 = ref_cell_nodes(local_270,iVar14,orig);
    if ((RVar5 == 0) &&
       ((((vector[orig[0]] == -1 || (vector[orig[1]] == -1)) || (vector[orig[3]] == -1)) ||
        (vector[orig[4]] == -1)))) {
      uVar6 = ref_cell_remove(local_270,iVar14);
      if (uVar6 != 0) {
        uVar17 = (ulong)uVar6;
        pcVar13 = "remove qua";
        uVar11 = 0x3eb;
        goto LAB_0018518c;
      }
      uVar6 = ref_shard_add_pyr_as_tet(ref_node,pRVar15,orig,1);
      if (uVar6 != 0) {
        uVar17 = (ulong)uVar6;
        pcVar13 = "converts to tets";
        uVar11 = 0x3ed;
        goto LAB_0018518c;
      }
    }
  }
  lVar9 = -1;
  iVar14 = 0;
  do {
    if (local_278->max <= iVar14) {
      free(__ptr);
      free(vector);
      pRVar4 = local_268;
      lVar9 = 0;
      while( true ) {
        if (ref_node->max <= lVar9) {
          return 0;
        }
        if ((((-1 < ref_node->global[lVar9]) &&
             ((pRVar3 = pRVar4->cell[8]->ref_adj, pRVar3->nnode <= lVar9 ||
              (pRVar3->first[lVar9] == -1)))) &&
            ((pRVar3 = pRVar4->cell[9]->ref_adj, pRVar3->nnode <= lVar9 ||
             (pRVar3->first[lVar9] == -1)))) &&
           ((((pRVar3 = pRVar4->cell[10]->ref_adj, pRVar3->nnode <= lVar9 ||
              (pRVar3->first[lVar9] == -1)) &&
             ((pRVar3 = pRVar4->cell[0xb]->ref_adj, pRVar3->nnode <= lVar9 ||
              (pRVar3->first[lVar9] == -1)))) &&
            (uVar6 = ref_node_remove_without_global(ref_node,(REF_INT)lVar9), uVar6 != 0)))) break;
        lVar9 = lVar9 + 1;
      }
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",0x420
             ,"ref_shard_prism_into_tet",(ulong)uVar6,"hang node");
      return uVar6;
    }
    RVar5 = ref_cell_nodes(local_278,iVar14,qua_nodes);
    pRVar2 = local_278;
    if ((RVar5 == 0) &&
       (((vector[qua_nodes[0]] == -1 || (vector[qua_nodes[1]] == -1)) ||
        ((vector[qua_nodes[2]] == -1 || (vector[qua_nodes[3]] == -1)))))) {
      uVar6 = ref_cell_remove(local_278,iVar14);
      pRVar15 = local_288;
      if (uVar6 != 0) {
        uVar17 = (ulong)uVar6;
        pcVar13 = "remove qua";
        uVar11 = 0x3f5;
        goto LAB_0018518c;
      }
      local_24c = qua_nodes[4];
      uVar17 = (ulong)(uint)pRVar2->node_per;
      if (pRVar2->node_per < 1) {
        uVar17 = 0;
      }
      for (uVar8 = 0; uVar17 != uVar8; uVar8 = uVar8 + 1) {
        iVar16 = qua_nodes[uVar8];
        lVar12 = lVar9;
        if (((-1 < (long)iVar16) && (iVar16 < ref_node->max)) &&
           (lVar12 = ref_node->global[iVar16], ref_node->global[iVar16] < 0)) {
          lVar12 = lVar9;
        }
        qua_global[uVar8] = lVar12;
      }
      if ((qua_global[0] < qua_global[1] && qua_global[0] < qua_global[3]) ||
         (qua_global[2] < qua_global[3] && qua_global[2] < qua_global[1])) {
        local_258 = qua_nodes[0];
        iStack_250 = qua_nodes[3];
        uVar6 = ref_shard_cell_add_local(ref_node,local_288,&local_258);
        if (uVar6 != 0) {
          uVar17 = (ulong)uVar6;
          pcVar13 = "a tri";
          uVar11 = 0x404;
          goto LAB_0018518c;
        }
        local_258 = qua_nodes[0];
        iStack_250 = qua_nodes[2];
        uVar6 = ref_shard_cell_add_local(ref_node,pRVar15,&local_258);
        if (uVar6 != 0) {
          uVar17 = (ulong)uVar6;
          pcVar13 = "a tri";
          uVar11 = 0x408;
          goto LAB_0018518c;
        }
      }
      else {
        local_258 = qua_nodes[0];
        iStack_250 = qua_nodes[3];
        uVar6 = ref_shard_cell_add_local(ref_node,local_288,&local_258);
        if (uVar6 != 0) {
          uVar17 = (ulong)uVar6;
          pcVar13 = "a tri";
          uVar11 = 0x410;
          goto LAB_0018518c;
        }
        local_258 = qua_nodes[2];
        iStack_250 = qua_nodes[1];
        uVar6 = ref_shard_cell_add_local(ref_node,pRVar15,&local_258);
        if (uVar6 != 0) {
          uVar17 = (ulong)uVar6;
          pcVar13 = "a tri";
          uVar11 = 0x414;
          goto LAB_0018518c;
        }
      }
    }
    iVar14 = iVar14 + 1;
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_shard_prism_into_tet(REF_GRID ref_grid,
                                            REF_INT keeping_n_layers,
                                            REF_DICT of_faceid) {
  REF_INT cell, tri_mark;

  REF_INT orig[REF_CELL_MAX_SIZE_PER];
  REF_CELL pri = ref_grid_pri(ref_grid);
  REF_CELL pyr = ref_grid_pyr(ref_grid);
  REF_CELL tet = ref_grid_tet(ref_grid);

  REF_INT tri_nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT qua_nodes[REF_CELL_MAX_SIZE_PER];
  REF_GLOB qua_global[REF_CELL_MAX_SIZE_PER];
  REF_CELL qua = ref_grid_qua(ref_grid);
  REF_CELL tri = ref_grid_tri(ref_grid);

  REF_NODE ref_node = ref_grid_node(ref_grid);

  REF_INT relaxation;
  REF_INT node;
  REF_INT *mark, *mark_copy;

  ref_malloc_init(mark, ref_node_max(ref_node), REF_INT, REF_EMPTY);
  ref_malloc_init(mark_copy, ref_node_max(ref_node), REF_INT, REF_EMPTY);

  /* mark nodes on prism tris */
  if (0 < keeping_n_layers && NULL != of_faceid)
    each_ref_cell_valid_cell_with_nodes(pri, cell, orig) {
      tri_nodes[0] = orig[0];
      tri_nodes[1] = orig[1];
      tri_nodes[2] = orig[2];
      RXS(ref_cell_with(tri, tri_nodes, &tri_mark), REF_NOT_FOUND, "with");
      if (REF_EMPTY != tri_mark) {
        if (ref_dict_has_key(of_faceid, ref_cell_c2n(tri, 3, tri_mark))) {
          mark[tri_nodes[0]] = 0;
          mark[tri_nodes[1]] = 0;
          mark[tri_nodes[2]] = 0;
        }
      }
      tri_nodes[0] = orig[3];
      tri_nodes[1] = orig[5];
      tri_nodes[2] = orig[4];
      RXS(ref_cell_with(tri, tri_nodes, &tri_mark), REF_NOT_FOUND, "with");
      if (REF_EMPTY != tri_mark) {
        if (ref_dict_has_key(of_faceid, ref_cell_c2n(tri, 3, tri_mark))) {
          mark[tri_nodes[0]] = 0;
          mark[tri_nodes[1]] = 0;
          mark[tri_nodes[2]] = 0;
        }
      }
    }
  RSS(ref_node_ghost_int(ref_node, mark, 1), "update ghost mark");

  for (relaxation = 0; relaxation < keeping_n_layers; relaxation++) {
    for (node = 0; node < ref_node_max(ref_node); node++)
      mark_copy[node] = mark[node];
    each_ref_cell_valid_cell_with_nodes(pri, cell, orig) {
      if (mark_copy[orig[0]] == REF_EMPTY && mark_copy[orig[3]] != REF_EMPTY)
        mark[orig[0]] = mark_copy[orig[3]] + 1;
      if (mark_copy[orig[3]] == REF_EMPTY && mark_copy[orig[0]] != REF_EMPTY)
        mark[orig[3]] = mark_copy[orig[0]] + 1;

      if (mark_copy[orig[1]] == REF_EMPTY && mark_copy[orig[4]] != REF_EMPTY)
        mark[orig[1]] = mark_copy[orig[4]] + 1;
      if (mark_copy[orig[4]] == REF_EMPTY && mark_copy[orig[1]] != REF_EMPTY)
        mark[orig[4]] = mark_copy[orig[1]] + 1;

      if (mark_copy[orig[2]] == REF_EMPTY && mark_copy[orig[5]] != REF_EMPTY)
        mark[orig[2]] = mark_copy[orig[5]] + 1;
      if (mark_copy[orig[5]] == REF_EMPTY && mark_copy[orig[2]] != REF_EMPTY)
        mark[orig[5]] = mark_copy[orig[2]] + 1;
    }
    RSS(ref_node_ghost_int(ref_node, mark, 1), "update ghost mark");
  }

  each_ref_cell_valid_cell_with_nodes(pri, cell, orig) {
    if (mark[orig[0]] != REF_EMPTY && mark[orig[3]] != REF_EMPTY) continue;

    RSS(ref_cell_remove(pri, cell), "remove pri");
    RSS(ref_shard_add_pri_as_tet(ref_node, tet, orig, REF_TRUE),
        "converts to tets");
  }

  each_ref_cell_valid_cell_with_nodes(pyr, cell, orig) {
    if (mark[orig[0]] != REF_EMPTY && mark[orig[1]] != REF_EMPTY &&
        mark[orig[3]] != REF_EMPTY && mark[orig[4]] != REF_EMPTY)
      continue;

    RSS(ref_cell_remove(pyr, cell), "remove qua");
    RSS(ref_shard_add_pyr_as_tet(ref_node, tet, orig, REF_TRUE),
        "converts to tets");
  }

  each_ref_cell_valid_cell_with_nodes(qua, cell, qua_nodes) {
    if (mark[qua_nodes[0]] != REF_EMPTY && mark[qua_nodes[1]] != REF_EMPTY &&
        mark[qua_nodes[2]] != REF_EMPTY && mark[qua_nodes[3]] != REF_EMPTY)
      continue;

    RSS(ref_cell_remove(qua, cell), "remove qua");
    tri_nodes[3] = qua_nodes[4]; /* patch id */

    for (node = 0; node < ref_cell_node_per(qua); node++)
      qua_global[node] = ref_node_global(ref_node, qua_nodes[node]);

    if ((qua_global[0] < qua_global[1] && qua_global[0] < qua_global[3]) ||
        (qua_global[2] < qua_global[1] &&
         qua_global[2] < qua_global[3])) { /* 0-2 diag split of quad */
                                           /* 2-1
                                              |\|
                                              3-0 */
      tri_nodes[0] = qua_nodes[0];
      tri_nodes[1] = qua_nodes[2];
      tri_nodes[2] = qua_nodes[3];
      RSS(ref_shard_cell_add_local(ref_node, tri, tri_nodes), "a tri");
      tri_nodes[0] = qua_nodes[0];
      tri_nodes[1] = qua_nodes[1];
      tri_nodes[2] = qua_nodes[2];
      RSS(ref_shard_cell_add_local(ref_node, tri, tri_nodes), "a tri");
    } else { /* 3-1 diag split of quad */
             /* 2-1
                |/|
                3-0 */
      tri_nodes[0] = qua_nodes[0];
      tri_nodes[1] = qua_nodes[1];
      tri_nodes[2] = qua_nodes[3];
      RSS(ref_shard_cell_add_local(ref_node, tri, tri_nodes), "a tri");
      tri_nodes[0] = qua_nodes[2];
      tri_nodes[1] = qua_nodes[3];
      tri_nodes[2] = qua_nodes[1];
      RSS(ref_shard_cell_add_local(ref_node, tri, tri_nodes), "a tri");
    }
  }

  ref_free(mark_copy);
  ref_free(mark);

  each_ref_node_valid_node(ref_node, node) {
    if (ref_adj_empty(ref_cell_adj(ref_grid_tet(ref_grid)), node) &&
        ref_adj_empty(ref_cell_adj(ref_grid_pyr(ref_grid)), node) &&
        ref_adj_empty(ref_cell_adj(ref_grid_pri(ref_grid)), node) &&
        ref_adj_empty(ref_cell_adj(ref_grid_hex(ref_grid)), node)) {
      RSS(ref_node_remove_without_global(ref_node, node), "hang node");
    }
  }

  return REF_SUCCESS;
}